

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::anon_unknown_36::HttpOutputStream::abortBody(HttpOutputStream *this)

{
  PromiseArenaMember *node;
  char *pcVar1;
  size_t sVar2;
  char (*in_RCX) [65];
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  String local_1c8;
  Fault local_1b0;
  Exception local_1a8;
  
  local_1a8.ownFile.content.ptr = &this->inBody;
  if (this->inBody == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x92a,FAILED,"inBody","_kjCondition,",(DebugExpression<bool_&> *)&local_1a8);
    kj::_::Debug::Fault::~Fault(&local_1b0);
  }
  else {
    this->inBody = false;
    this->broken = true;
    kj::_::Debug::makeDescription<char_const(&)[65]>
              (&local_1c8,(Debug *)0x5113e6,
               "previous HTTP message body incomplete; can\'t write more messages",in_RCX);
    Exception::Exception
              (&local_1a8,FAILED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x930,&local_1c8);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)&local_1b0,&local_1a8);
    node = &((this->writeQueue).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
    (this->writeQueue).super_PromiseBase.node.ptr = (PromiseNode *)local_1b0.exception;
    if (node != (PromiseArenaMember *)0x0) {
      kj::_::PromiseDisposer::dispose(node);
    }
    Exception::~Exception(&local_1a8);
    sVar2 = local_1c8.content.size_;
    pcVar1 = local_1c8.content.ptr;
    if (local_1c8.content.ptr != (char *)0x0) {
      local_1c8.content.ptr = (char *)0x0;
      local_1c8.content.size_ = 0;
      (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
                (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  return;
}

Assistant:

void abortBody() {
    // Called if the application failed to write all expected body bytes.
    KJ_REQUIRE(inBody) { return; }
    inBody = false;
    broken = true;

    // Cancel any writes that are still queued.
    writeQueue = KJ_EXCEPTION(FAILED,
        "previous HTTP message body incomplete; can't write more messages");
  }